

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_mp3_get_length_in_pcm_frames(ma_mp3 *pMP3,ma_uint64 *pLength)

{
  ma_uint64 mVar1;
  ma_dr_mp3 *in_RSI;
  long in_RDI;
  ma_result local_4;
  
  if (in_RSI == (ma_dr_mp3 *)0x0) {
    local_4 = MA_INVALID_ARGS;
  }
  else {
    *(float *)((long)((in_RSI->decoder).mdct_overlap + 0) + 0) = 0.0;
    *(float *)((long)((in_RSI->decoder).mdct_overlap + 0) + 4) = 0.0;
    if (in_RDI == 0) {
      local_4 = MA_INVALID_ARGS;
    }
    else {
      mVar1 = ma_dr_mp3_get_pcm_frame_count(in_RSI);
      *(ma_uint64 *)(in_RSI->decoder).mdct_overlap[0] = mVar1;
      local_4 = MA_SUCCESS;
    }
  }
  return local_4;
}

Assistant:

MA_API ma_result ma_mp3_get_length_in_pcm_frames(ma_mp3* pMP3, ma_uint64* pLength)
{
    if (pLength == NULL) {
        return MA_INVALID_ARGS;
    }

    *pLength = 0;   /* Safety. */

    if (pMP3 == NULL) {
        return MA_INVALID_ARGS;
    }

    #if !defined(MA_NO_MP3)
    {
        *pLength = ma_dr_mp3_get_pcm_frame_count(&pMP3->dr);

        return MA_SUCCESS;
    }
    #else
    {
        /* mp3 is disabled. Should never hit this since initialization would have failed. */
        MA_ASSERT(MA_FALSE);
        return MA_NOT_IMPLEMENTED;
    }
    #endif
}